

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__shader____glsl_shader_type
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  bool bVar1;
  ulong in_RAX;
  int *piVar2;
  StringHash SVar3;
  int iVar4;
  xmlChar **ppxVar5;
  uint *puVar6;
  ulong uVar7;
  bool bVar8;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  piVar2 = (int *)GeneratedSaxParser::StackMemoryManager::newObject
                            (&(this->
                              super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                              ).super_ParserTemplateBase.mStackMemoryManager,4);
  *piVar2 = 5;
  *attributeDataPtr = piVar2;
  ppxVar5 = attributes->attributes;
  if (ppxVar5 != (xmlChar **)0x0) {
    do {
      text = *ppxVar5;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar5[1];
        ppxVar5 = ppxVar5 + 2;
        if (SVar3 == 0x7aa7d5) {
          SVar3 = GeneratedSaxParser::Utils::calculateStringHash
                            (additionalText,(bool *)((long)&uStack_38 + 7));
          bVar8 = false;
          uVar7 = 0;
          puVar6 = &DAT_0085af88;
          do {
            if (*(StringHash *)(puVar6 + -2) == SVar3) {
              uStack_38 = uStack_38 & 0xffffffffffffff;
              validationDataPtr = (void **)(ulong)*puVar6;
            }
            iVar4 = (int)validationDataPtr;
            if (*(StringHash *)(puVar6 + -2) == SVar3) break;
            bVar8 = 2 < uVar7;
            uVar7 = uVar7 + 1;
            puVar6 = puVar6 + 4;
          } while (uVar7 != 4);
          if (bVar8) {
            uStack_38 = CONCAT17(1,(undefined7)uStack_38);
            iVar4 = 4;
          }
          *piVar2 = iVar4;
          if (uStack_38._7_1_ == '\x01') {
            bVar8 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x79e7ac2,0x7aa7d5,additionalText);
            if (!bVar1) goto LAB_0073bc8c;
            validationDataPtr = (void **)0x1;
          }
          else {
LAB_0073bc8c:
            validationDataPtr = (void **)0x4;
            bVar8 = true;
          }
          if (!bVar8) goto LAB_0073bc82;
        }
        else {
          bVar8 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x79e7ac2,text,additionalText);
          validationDataPtr = (void **)0x1;
          if (bVar8) goto LAB_0073bc82;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_0073bc82:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*piVar2 == 5) &&
     (bVar8 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x79e7ac2,0x7aa7d5,(ParserChar *)0x0),
     bVar8)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__shader____glsl_shader_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__shader____glsl_shader_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

shader____glsl_shader_type__AttributeData* attributeData = newData<shader____glsl_shader_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_STAGE:
    {
bool failed;
attributeData->stage = Utils::toEnum<ENUM__fx_pipeline_stage_enum, StringHash, ENUM__fx_pipeline_stage_enum__COUNT>(attributeValue, failed, ENUM__fx_pipeline_stage_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SHADER,
        HASH_ATTRIBUTE_STAGE,
        attributeValue))
{
    return false;
}

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_SHADER, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ( attributeData->stage == ENUM__fx_pipeline_stage_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_SHADER, HASH_ATTRIBUTE_STAGE, 0 ) )
        return false;
}


    return true;
}